

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_debugXML(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing debugXML : 25 of 28 functions ...\n");
  }
  iVar1 = test_xmlBoolToText();
  iVar2 = test_xmlDebugCheckDocument();
  iVar3 = test_xmlDebugDumpAttr();
  iVar4 = test_xmlDebugDumpAttrList();
  iVar5 = test_xmlDebugDumpDTD();
  iVar6 = test_xmlDebugDumpDocument();
  iVar7 = test_xmlDebugDumpDocumentHead();
  iVar8 = test_xmlDebugDumpEntities();
  iVar9 = test_xmlDebugDumpNode();
  iVar10 = test_xmlDebugDumpNodeList();
  iVar11 = test_xmlDebugDumpOneNode();
  iVar12 = test_xmlDebugDumpString();
  iVar13 = test_xmlLsCountNode();
  iVar14 = test_xmlLsOneNode();
  iVar15 = test_xmlShell();
  iVar16 = test_xmlShellBase();
  iVar17 = test_xmlShellCat();
  iVar18 = test_xmlShellDir();
  iVar19 = test_xmlShellDu();
  iVar20 = test_xmlShellList();
  iVar21 = test_xmlShellLoad();
  iVar22 = test_xmlShellPrintXPathResult();
  iVar23 = test_xmlShellPwd();
  iVar24 = test_xmlShellSave();
  iVar25 = test_xmlShellValidate();
  iVar26 = test_xmlShellWrite();
  uVar27 = iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + iVar18 + iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar27 != 0) {
    printf("Module debugXML: %d errors\n",(ulong)uVar27);
  }
  return uVar27;
}

Assistant:

static int
test_debugXML(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing debugXML : 25 of 28 functions ...\n");
    test_ret += test_xmlBoolToText();
    test_ret += test_xmlDebugCheckDocument();
    test_ret += test_xmlDebugDumpAttr();
    test_ret += test_xmlDebugDumpAttrList();
    test_ret += test_xmlDebugDumpDTD();
    test_ret += test_xmlDebugDumpDocument();
    test_ret += test_xmlDebugDumpDocumentHead();
    test_ret += test_xmlDebugDumpEntities();
    test_ret += test_xmlDebugDumpNode();
    test_ret += test_xmlDebugDumpNodeList();
    test_ret += test_xmlDebugDumpOneNode();
    test_ret += test_xmlDebugDumpString();
    test_ret += test_xmlLsCountNode();
    test_ret += test_xmlLsOneNode();
    test_ret += test_xmlShell();
    test_ret += test_xmlShellBase();
    test_ret += test_xmlShellCat();
    test_ret += test_xmlShellDir();
    test_ret += test_xmlShellDu();
    test_ret += test_xmlShellList();
    test_ret += test_xmlShellLoad();
    test_ret += test_xmlShellPrintXPathResult();
    test_ret += test_xmlShellPwd();
    test_ret += test_xmlShellSave();
    test_ret += test_xmlShellValidate();
    test_ret += test_xmlShellWrite();

    if (test_ret != 0)
	printf("Module debugXML: %d errors\n", test_ret);
    return(test_ret);
}